

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void bitset_container_offset
               (bitset_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  bitset_container_t *bitset;
  sbyte sVar6;
  undefined6 in_register_0000000a;
  ulong uVar7;
  uint64_t *puVar8;
  ulong uVar9;
  long lVar10;
  short sVar11;
  uint uVar12;
  uint uVar13;
  
  uVar2 = CONCAT62(in_register_0000000a,offset) >> 6;
  uVar3 = (uint)uVar2;
  uVar12 = (uint)CONCAT62(in_register_0000000a,offset) & 0x3f;
  uVar13 = 0x400 - (uVar3 & 0x3ffffff);
  sVar11 = (short)uVar12;
  sVar6 = (sbyte)uVar12;
  if (loc == (container_t **)0x0) {
    if (hic == (container_t **)0x0) {
      bitset = (bitset_container_t *)0x0;
      goto LAB_0010a1be;
    }
LAB_0010a0f3:
    bitset = bitset_container_create();
  }
  else {
    bitset = bitset_container_create();
    if (sVar11 == 0) {
      memcpy((void *)((ulong)((uVar3 & 0xffff) << 3) + (long)bitset->words),c->words,
             (ulong)((uVar13 & 0xffff) << 3));
    }
    else {
      puVar1 = c->words;
      puVar8 = bitset->words;
      uVar7 = uVar2 & 0xffff;
      puVar8[uVar7] = *puVar1 << sVar6;
      if ((int)uVar7 != 0x3ff) {
        uVar12 = 2;
        if (2 < (ushort)uVar13) {
          uVar12 = uVar13;
        }
        uVar9 = 1;
        do {
          puVar8[uVar7 + uVar9] =
               puVar1[uVar9 - 1] >> (0x40U - sVar6 & 0x3f) | puVar1[uVar9] << sVar6;
          uVar9 = uVar9 + 1;
        } while ((uVar12 & 0xffff) != uVar9);
      }
    }
    iVar5 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar5;
    if (iVar5 != 0) {
      *loc = bitset;
    }
    if (iVar5 == c->cardinality) {
      return;
    }
    if (hic == (container_t **)0x0) {
      if (iVar5 != 0) {
        return;
      }
      goto LAB_0010a1be;
    }
    if (iVar5 != 0) goto LAB_0010a0f3;
  }
  if (sVar11 == 0) {
    memcpy(bitset->words,(void *)((ulong)((uVar13 & 0xffff) << 3) + (long)c->words),
           (ulong)((uVar3 & 0xffff) << 3));
  }
  else {
    puVar1 = c->words;
    if (offset < 0x40) {
      puVar8 = bitset->words;
      bVar4 = 0x40 - sVar6;
    }
    else {
      bVar4 = 0x40 - sVar6;
      puVar8 = bitset->words;
      uVar7 = (ulong)(uVar13 & 0xffff);
      lVar10 = 0;
      do {
        puVar8[lVar10] =
             puVar1[uVar7 + lVar10 + -1] >> (bVar4 & 0x3f) | puVar1[uVar7 + lVar10] << sVar6;
        lVar10 = lVar10 + 1;
      } while (0x400 - uVar7 != lVar10);
    }
    puVar8[uVar2 & 0xffff] = puVar1[0x3ff] >> (bVar4 & 0x3f);
  }
  iVar5 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar5;
  if (iVar5 != 0) {
    *hic = bitset;
    return;
  }
LAB_0010a1be:
  (*global_memory_hook.aligned_free)(bitset->words);
  (*global_memory_hook.free)(bitset);
  return;
}

Assistant:

void bitset_container_offset(const bitset_container_t *c, container_t **loc,
                             container_t **hic, uint16_t offset) {
    bitset_container_t *bc = NULL;
    uint64_t val;
    uint16_t b, i, end;

    b = offset >> 6;
    i = offset % 64;
    end = 1024 - b;

    if (loc != NULL) {
        bc = bitset_container_create();
        if (i == 0) {
            memcpy(bc->words + b, c->words, 8 * end);
        } else {
            bc->words[b] = c->words[0] << i;
            for (uint32_t k = 1; k < end; ++k) {
                val = c->words[k] << i;
                val |= c->words[k - 1] >> (64 - i);
                bc->words[b + k] = val;
            }
        }

        bc->cardinality = bitset_container_compute_cardinality(bc);
        if (bc->cardinality != 0) {
            *loc = bc;
        }
        if (bc->cardinality == c->cardinality) {
            return;
        }
    }

    if (hic == NULL) {
        // Both hic and loc can't be NULL, so bc is never NULL here
        if (bc->cardinality == 0) {
            bitset_container_free(bc);
        }
        return;
    }

    if (bc == NULL || bc->cardinality != 0) {
        bc = bitset_container_create();
    }

    if (i == 0) {
        memcpy(bc->words, c->words + end, 8 * b);
    } else {
        for (uint32_t k = end; k < 1024; ++k) {
            val = c->words[k] << i;
            val |= c->words[k - 1] >> (64 - i);
            bc->words[k - end] = val;
        }
        bc->words[b] = c->words[1023] >> (64 - i);
    }

    bc->cardinality = bitset_container_compute_cardinality(bc);
    if (bc->cardinality == 0) {
        bitset_container_free(bc);
        return;
    }
    *hic = bc;
}